

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL5RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  undefined8 in_RAX;
  uint Op5;
  uint Op4;
  undefined8 local_38;
  
  uVar1 = Insn >> 6 & 0x1f;
  if (uVar1 < 0x1b) {
    Decoder = (void *)(ulong)(Insn & 3);
    local_38 = in_RAX;
    DVar2 = Decode2OpInstruction(Insn >> 0x10,(uint *)((long)&local_38 + 4),(uint *)&local_38);
    if (DVar2 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass(Inst,(Insn >> 4 & 3) + (uVar1 % 3) * 4,Address,Decoder);
      DecodeGRRegsRegisterClass(Inst,local_38._4_4_,Address,Decoder);
      DecodeGRRegsRegisterClass
                (Inst,(Insn >> 2 & 3) + (uVar1 / 3 + (uVar1 / 9) * -3) * 4,Address,Decoder);
      DecodeGRRegsRegisterClass(Inst,(Insn & 3) + (uVar1 / 9) * 4,Address,Decoder);
      DecodeGRRegsRegisterClass(Inst,(uint)local_38,Address,Decoder);
      return MCDisassembler_Success;
    }
  }
  DVar2 = DecodeL5RInstructionFail(Inst,Insn,Address,Decoder);
  return DVar2;
}

Assistant:

static DecodeStatus DecodeL5RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	S = Decode2OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	return S;
}